

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O0

int nn_respondent_events(nn_sockbase *self)

{
  nn_sockbase *in_RDI;
  nn_respondent *respondent;
  int events;
  uint local_c;
  
  if (in_RDI == (nn_sockbase *)0x0) {
    in_RDI = (nn_sockbase *)0x0;
  }
  local_c = nn_xrespondent_events(in_RDI);
  if (((ulong)in_RDI[0x1b].vfptr & 1) == 0) {
    local_c = local_c & 0xfffffffd;
  }
  return local_c;
}

Assistant:

static int nn_respondent_events (struct nn_sockbase *self)
{
    int events;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    events = nn_xrespondent_events (&respondent->xrespondent.sockbase);
    if (!(respondent->flags & NN_RESPONDENT_INPROGRESS))
        events &= ~NN_SOCKBASE_EVENT_OUT;
    return events;
}